

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Canceler * __thiscall
kj::_::NullableValue<kj::Canceler>::emplace<>(NullableValue<kj::Canceler> *this)

{
  if (this->isSet == true) {
    this->isSet = false;
    Canceler::~Canceler(&(this->field_1).value);
  }
  this->field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Canceler>_2)0x0;
  this->isSet = true;
  return (Canceler *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }